

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-command.c
# Opt level: O3

void textui_cmd_rest(void)

{
  _Bool _Var1;
  wchar_t wVar2;
  command_conflict *cmd;
  wchar_t choice;
  char out_val [5];
  uint local_10;
  undefined1 local_c;
  
  local_c = 0;
  local_10 = 0x2026;
  _Var1 = get_string("Rest (0-9999, \'!\' for HP or SP, \'*\' for HP and SP, \'&\' as needed): ",
                     (char *)&local_10,5);
  if (_Var1) {
    if ((local_10 & 0xff) == 0x21) {
      choice = L'\xfffffffd';
    }
    else if ((local_10 & 0xff) == 0x26) {
      choice = L'\xfffffffe';
    }
    else if ((char)local_10 == '*') {
      choice = L'\xffffffff';
    }
    else {
      wVar2 = atoi((char *)&local_10);
      if (wVar2 < L'\x01') {
        return;
      }
      choice = L'✏';
      if ((uint)wVar2 < 9999) {
        choice = wVar2;
      }
    }
    cmdq_push(CMD_REST);
    cmd = cmdq_peek();
    cmd_set_arg_choice(cmd,"choice",choice);
  }
  return;
}

Assistant:

void textui_cmd_rest(void)
{
	const char *p = "Rest (0-9999, '!' for HP or SP, '*' for HP and SP, '&' as needed): ";

	char out_val[5] = "& ";

	/* Ask for duration */
	if (!get_string(p, out_val, sizeof(out_val))) return;

	/* Rest... */
	if (out_val[0] == '&') {
		/* ...until done */
		cmdq_push(CMD_REST);
		cmd_set_arg_choice(cmdq_peek(), "choice", REST_COMPLETE);
	} else if (out_val[0] == '*') {
		/* ...a lot */
		cmdq_push(CMD_REST);
		cmd_set_arg_choice(cmdq_peek(), "choice", REST_ALL_POINTS);
	} else if (out_val[0] == '!') {
		/* ...until HP or SP filled */
		cmdq_push(CMD_REST);
		cmd_set_arg_choice(cmdq_peek(), "choice", REST_SOME_POINTS);
	} else {
		/* ...some */
		int turns = atoi(out_val);
		if (turns <= 0) return;
		if (turns > 9999) turns = 9999;

		cmdq_push(CMD_REST);
		cmd_set_arg_choice(cmdq_peek(), "choice", turns);
	}
}